

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall clunk::Node::ExecNullMove<true>(Node *this,Node *dest)

{
  Node *dest_local;
  Node *this_local;
  
  if ((this->state & 1U) == 0) {
    __assert_fail("COLOR(state) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xbc2,"void clunk::Node::ExecNullMove(Node &) const [color = true]");
  }
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xbc3,"void clunk::Node::ExecNullMove(Node &) const [color = true]");
  }
  if (dest == this) {
    __assert_fail("&dest != this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xbc4,"void clunk::Node::ExecNullMove(Node &) const [color = true]");
  }
  DAT_001aabc8 = DAT_001aabc8 + 1;
  dest->state = this->state ^ 1;
  dest->ep = 0x78;
  dest->rcount = this->rcount;
  dest->mcount = this->mcount;
  dest->pawnKey = this->pawnKey;
  dest->pieceKey = this->pieceKey;
  dest->positionKey =
       dest->pawnKey ^ dest->pieceKey ^ *(ulong *)(_HASH + (long)(int)(dest->state & 0x1f) * 8) ^
       *(ulong *)(_HASH + (long)dest->ep * 8 + 0x400);
  Move::Clear(&dest->lastMove);
  dest->standPat = _material - DAT_001949b4;
  if (this->ply + -32000 < this->standPat) {
    dest->checks = 0;
    return;
  }
  __assert_fail("standPat > (ply - Infinity)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0xbd5,"void clunk::Node::ExecNullMove(Node &) const [color = true]");
}

Assistant:

inline void ExecNullMove(Node& dest) const {
    assert(COLOR(state) == color);
    assert(!checks);
    assert(&dest != this);

    _stats.nullMoves++;

    dest.state = (state ^ 1);
    dest.ep = None;
    dest.rcount = rcount;
    dest.mcount = mcount;
    dest.pawnKey = pawnKey;
    dest.pieceKey = pieceKey;
    dest.positionKey = (dest.pawnKey ^
                        dest.pieceKey ^
                        _HASH[0][dest.state & 0x1F] ^
                        _HASH[1][dest.ep]);

    dest.lastMove.Clear();
    dest.standPat = (_material[!color] - _material[color]);
    assert(standPat > (ply - Infinity));
    dest.checks = 0;

#if 0
    assert(VerifyAttacks(true));
#endif
  }